

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.hpp
# Opt level: O1

void __thiscall
ArrayDescriptor::ArrayDescriptor
          (ArrayDescriptor *this,vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *array)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_58;
  size_type local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_38;
  
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&local_38,array);
  (this->super_TypeDescriptor)._vptr_TypeDescriptor = (_func_int **)&PTR__TypeDescriptor_0011da98;
  (this->super_TypeDescriptor)._number = 0.0;
  paVar1 = &(this->super_TypeDescriptor)._string.field_2;
  (this->super_TypeDescriptor)._string._M_dataplus._M_p = (pointer)paVar1;
  if (local_58 == &local_48) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_47,local_48);
    *(undefined8 *)((long)&(this->super_TypeDescriptor)._string.field_2 + 8) = uStack_40;
  }
  else {
    (this->super_TypeDescriptor)._string._M_dataplus._M_p = local_58;
    (this->super_TypeDescriptor)._string.field_2._M_allocated_capacity =
         CONCAT71(uStack_47,local_48);
  }
  (this->super_TypeDescriptor)._string._M_string_length = local_50;
  (this->super_TypeDescriptor)._boolean = 0.0;
  (this->super_TypeDescriptor)._array.
  super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_TypeDescriptor)._array.
  super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->super_TypeDescriptor)._array.
  super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->super_TypeDescriptor)._type = ARRAY;
  local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48 = '\0';
  local_50 = 0;
  (this->super_TypeDescriptor)._vptr_TypeDescriptor = (_func_int **)&PTR__ArrayDescriptor_0011dd90;
  local_58 = &local_48;
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&this->_array,array);
  return;
}

Assistant:

explicit ArrayDescriptor(std::vector<TypeDescriptor*>array):  TypeDescriptor(ARRAY, 0, "",false, array), _array{array} {}